

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O1

void __thiscall
Lodtalk::AST::MessageSendNode::MessageSendNode
          (MessageSendNode *this,string *selector,Node *receiver,Node *firstArgument)

{
  pointer *pppNVar1;
  pointer pcVar2;
  iterator __position;
  Node *local_30;
  
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__MessageSendNode_00163e88;
  (this->selector)._M_dataplus._M_p = (pointer)&(this->selector).field_2;
  pcVar2 = (selector->_M_dataplus)._M_p;
  local_30 = firstArgument;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->selector,pcVar2,pcVar2 + selector->_M_string_length);
  this->receiver = receiver;
  (this->arguments).super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->arguments).super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->arguments).super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->chainedMessages).
  super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->chainedMessages).
  super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->chainedMessages).
  super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __position._M_current =
       (this->arguments).
       super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->arguments).
      super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Lodtalk::AST::Node*,std::allocator<Lodtalk::AST::Node*>>::
    _M_realloc_insert<Lodtalk::AST::Node*const&>
              ((vector<Lodtalk::AST::Node*,std::allocator<Lodtalk::AST::Node*>> *)&this->arguments,
               __position,&local_30);
  }
  else {
    *__position._M_current = local_30;
    pppNVar1 = &(this->arguments).
                super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  return;
}

Assistant:

MessageSendNode::MessageSendNode(const std::string &selector, Node *receiver, Node *firstArgument)
	: selector(selector), receiver(receiver)
{
	arguments.push_back(firstArgument);
}